

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O1

adt_error_t adt_ary_unshift(adt_ary_t *self,void *pElem)

{
  int iVar1;
  adt_error_t aVar2;
  void **ppvVar3;
  size_t __n;
  uint uVar4;
  void **__src;
  
  if (self == (adt_ary_t *)0x0) {
    aVar2 = '\x01';
  }
  else {
    iVar1 = self->s32CurLen;
    aVar2 = '\x04';
    if (iVar1 != 0x7fffffff) {
      ppvVar3 = self->pFirst;
      if (self->ppAlloc < ppvVar3) {
        self->pFirst = ppvVar3 + -1;
        ppvVar3[-1] = pElem;
        self->s32CurLen = iVar1 + 1;
        aVar2 = '\0';
      }
      else {
        aVar2 = adt_ary_extend(self,iVar1 + 1);
        if (aVar2 == '\0') {
          uVar4 = self->s32CurLen * 8 - 8;
          if (uVar4 != 0) {
            __src = self->pFirst;
            ppvVar3 = __src + 1;
            do {
              __n = 0x10000;
              if (uVar4 < 0x10000) {
                __n = (size_t)uVar4;
              }
              memmove(ppvVar3,__src,__n);
              ppvVar3 = (void **)((long)ppvVar3 + __n);
              __src = (void **)((long)__src + __n);
              uVar4 = uVar4 - (int)__n;
            } while (uVar4 != 0);
          }
          *self->pFirst = pElem;
        }
      }
    }
  }
  return aVar2;
}

Assistant:

adt_error_t	adt_ary_unshift(adt_ary_t *self, void *pElem){
   if ( self != 0 ) {
      if (self->s32CurLen == INT32_MAX) {
         return ADT_LENGTH_ERROR; //cannot fit any more elements into the array
      }
      if(self->pFirst > self->ppAlloc){
         //room for one more element at the beginning
         *(--self->pFirst)=pElem;
         self->s32CurLen++;
         return ADT_NO_ERROR;
      }
      else {
         //no room at beginning of array, move all array data forward by one
         uint8_t *pBegin,*pEnd;
         adt_error_t result;
         uint32_t u32ElemSize = sizeof(void**);
         result = adt_ary_extend(self,(int32_t) (self->s32CurLen+1));
         if (result == ADT_NO_ERROR) {
            uint32_t u32Remain;
            pBegin = (uint8_t*) self->pFirst+u32ElemSize;
            pEnd = ((uint8_t*) &self->pFirst[self->s32CurLen]);
            u32Remain = (uint32_t) (pEnd-pBegin);
            adt_block_memmove(pBegin, (uint8_t*) self->pFirst, u32Remain);
            self->pFirst[0]=pElem;
         }
         return result;
      }
   }
	return ADT_INVALID_ARGUMENT_ERROR;
}